

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

bool __thiscall
cmsys::SystemInformationImplementation::RetreiveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  long lVar8;
  ulonglong uVar9;
  long *plVar10;
  long *plVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  ulong uVar14;
  char cVar15;
  float fVar16;
  string cpuflags;
  string buffer;
  string cpurev;
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string familyStr;
  string CPUSpeed;
  string cores;
  string idc;
  string local_378;
  undefined1 *local_358;
  long local_350;
  undefined1 local_348;
  undefined7 uStack_347;
  string local_338;
  char **local_318;
  iterator iStack_310;
  char **local_308;
  string local_2f8;
  string local_2d8;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  string local_298;
  FILE *local_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  local_358 = &local_348;
  local_350 = 0;
  local_348 = 0;
  __stream = fopen64("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    goto LAB_0040eee1;
  }
  iVar6 = feof(__stream);
  cVar15 = -2;
  if (iVar6 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&local_358);
      iVar6 = feof(__stream);
      cVar15 = cVar15 + '\x01';
    } while (iVar6 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&local_358,cVar15);
  lVar8 = std::__cxx11::string::find((char *)&local_358,0x4f0c47,0);
  if (lVar8 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar8 = std::__cxx11::string::find((char *)&local_358,0x4f0c47,lVar8 + 1);
    } while (lVar8 != -1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_70,this,&local_90,"physical id",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_278 = __stream;
  if (this->CurrentPositionInFile == 0xffffffffffffffff) {
    iVar6 = -1;
  }
  else {
    iVar6 = -1;
    do {
      iVar7 = atoi(local_70._M_dataplus._M_p);
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_358,local_358 + local_350)
      ;
      ExtractValueFromCpuInfoFile
                (&local_298,this,&local_b0,"physical id",this->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    } while (this->CurrentPositionInFile != 0xffffffffffffffff);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_298,this,&local_d0,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 < 1) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_358,local_358 + local_350);
    ExtractValueFromCpuInfoFile(&local_2d8,this,&local_f0,"ncpus active",0);
    _Var13._M_p = local_2d8._M_dataplus._M_p;
    uVar12 = atoi(local_2d8._M_dataplus._M_p);
    this->NumberOfPhysicalCPU = uVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != &local_2d8.field_2) {
      operator_delete(_Var13._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    uVar12 = this->NumberOfPhysicalCPU;
  }
  else {
    iVar7 = atoi(local_298._M_dataplus._M_p);
    uVar12 = (iVar6 + 1) * iVar7;
    this->NumberOfPhysicalCPU = uVar12;
  }
  if (uVar12 == 0) {
    this->NumberOfPhysicalCPU = 1;
    uVar12 = 1;
  }
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = this->NumberOfLogicalCPU / uVar12
  ;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_2d8,this,&local_110,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8._M_string_length == 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_358,local_358 + local_350);
    ExtractValueFromCpuInfoFile(&local_2f8,this,&local_130,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    uVar9 = strtoull(local_2d8._M_dataplus._M_p,(char **)0x0,0x10);
    fVar16 = (float)uVar9 / 1e+06;
  }
  else {
    dVar4 = atof(local_2d8._M_dataplus._M_p);
    fVar16 = (float)dVar4;
  }
  this->CPUSpeedInMHz = fVar16;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_2f8,this,&local_150,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8._M_string_length == 0) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_358,local_358 + local_350);
    ExtractValueFromCpuInfoFile(&local_338,this,&local_170,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = atoi(local_2f8._M_dataplus._M_p);
  (this->ChipID).Family = iVar6;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_338,this,&local_190,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&local_338);
  paVar2 = &local_338.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(this,&local_2f8);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    iVar6 = std::__cxx11::string::compare((char *)&local_2f8);
    if (iVar6 == 0) {
      iVar6 = 0x11a;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_2f8);
      if (iVar6 != 0) goto LAB_0040e68e;
      iVar6 = 0x200;
    }
    (this->ChipID).Family = iVar6;
  }
LAB_0040e68e:
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_338,this,&local_1b0,"model",0);
  _Var13._M_p = local_338._M_dataplus._M_p;
  iVar6 = atoi(local_338._M_dataplus._M_p);
  (this->ChipID).Model = iVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var13._M_p != paVar2) {
    operator_delete(_Var13._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  bVar5 = RetrieveClassicalCPUIdentity(this);
  if (!bVar5) {
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,local_358,local_358 + local_350);
    ExtractValueFromCpuInfoFile(&local_338,this,&local_1d0,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (local_338._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_338,this,&local_1f0,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_338._M_string_length == 0) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_358,local_358 + local_350);
    ExtractValueFromCpuInfoFile(&local_378,this,&local_210,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&local_338,(string *)&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = atoi(local_338._M_dataplus._M_p);
  (this->ChipID).Revision = iVar6;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_230,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_378,this,&local_230,"model name",0);
  _Var13._M_p = local_378._M_dataplus._M_p;
  pcVar3 = (char *)(this->ChipID).ModelName._M_string_length;
  strlen(local_378._M_dataplus._M_p);
  std::__cxx11::string::_M_replace((ulong)&(this->ChipID).ModelName,0,pcVar3,(ulong)_Var13._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_318 = (char **)0x0;
  iStack_310._M_current = (char **)0x0;
  local_308 = (char **)0x0;
  local_378._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_318,(iterator)0x0,
             (char **)&local_378);
  local_378._M_dataplus._M_p = "I-cache";
  if (iStack_310._M_current == local_308) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_318,iStack_310,
               (char **)&local_378);
  }
  else {
    *iStack_310._M_current = "I-cache";
    iStack_310._M_current = iStack_310._M_current + 1;
  }
  local_378._M_dataplus._M_p = "D-cache";
  if (iStack_310._M_current == local_308) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_318,iStack_310,
               (char **)&local_378);
  }
  else {
    *iStack_310._M_current = "D-cache";
    iStack_310._M_current = iStack_310._M_current + 1;
  }
  (this->Features).L1CacheSize = 0;
  if (iStack_310._M_current != local_318) {
    uVar14 = 0;
    do {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_358,local_358 + local_350);
      ExtractValueFromCpuInfoFile(&local_378,this,&local_250,local_318[uVar14],0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      _Var13._M_p = local_378._M_dataplus._M_p;
      if (local_378._M_string_length != 0) {
        lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d0d,0);
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_378);
          std::__cxx11::string::operator=((string *)&local_378,(string *)&local_2b8);
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,local_2a8 + 1);
          }
        }
        _Var13._M_p = local_378._M_dataplus._M_p;
        iVar6 = atoi(local_378._M_dataplus._M_p);
        piVar1 = &(this->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar6;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &local_378.field_2) {
        operator_delete(_Var13._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)iStack_310._M_current - (long)local_318 >> 3));
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_270,local_358,local_358 + local_350);
  ExtractValueFromCpuInfoFile(&local_378,this,&local_270,"flags",0);
  __stream = local_278;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_338._M_string_length != 0) {
    std::operator+(&local_50," ",&local_378);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_2a8 = *plVar11;
      lStack_2a0 = plVar10[3];
      local_2b8 = &local_2a8;
    }
    else {
      local_2a8 = *plVar11;
      local_2b8 = (long *)*plVar10;
    }
    local_2b0 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_378,(string *)&local_2b8);
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d11,0);
    if (lVar8 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d17,0);
    if (lVar8 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d1d,0);
    if (lVar8 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d23,0);
    if (lVar8 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d29,0);
    if (lVar8 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d30,0);
    if (lVar8 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d37,0);
    if (lVar8 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d3e,0);
    if (lVar8 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d45,0);
    if (lVar8 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar8 = std::__cxx11::string::find((char *)&local_378,0x4f0d4c,0);
    if (lVar8 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != (char **)0x0) {
    operator_delete(local_318,(long)local_308 - (long)local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_0040eee1:
  if (local_358 != &local_348) {
    operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool SystemInformationImplementation::RetreiveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE *fd = fopen("/proc/cpuinfo", "r" );
  if ( !fd )
    {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
    }

  size_t fileSize = 0;
  while(!feof(fd))
    {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
    }
  fclose( fd );
  buffer.resize(fileSize-2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and hyperthreading)
  size_t pos = buffer.find("processor\t");
  while(pos != buffer.npos)
    {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t",pos+1);
    }

#ifdef __linux
  // Find the largest physical id.
  int maxId = -1;
  std::string idc =
                       this->ExtractValueFromCpuInfoFile(buffer,"physical id");
  while(this->CurrentPositionInFile != buffer.npos)
    {
      int id = atoi(idc.c_str());
      if(id > maxId)
      {
       maxId=id;
      }
    idc = this->ExtractValueFromCpuInfoFile(buffer,"physical id",
                                            this->CurrentPositionInFile+1);
    }
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string cores =
                        this->ExtractValueFromCpuInfoFile(buffer,"cpu cores");
  int numberOfCoresPerCPU=atoi(cores.c_str());
  if (maxId > 0)
    {
    this->NumberOfPhysicalCPU=static_cast<unsigned int>(
      numberOfCoresPerCPU*(maxId+1));
    }
  else
    {
    // Linux Sparc: get cpu count
    this->NumberOfPhysicalCPU=
            atoi(this->ExtractValueFromCpuInfoFile(buffer,"ncpus active").c_str());
    }

#else // __CYGWIN__
  // does not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer,"cpu count");
  this->NumberOfPhysicalCPU=
    this->NumberOfLogicalCPU = atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if(this->NumberOfPhysicalCPU <= 0)
    {
    this->NumberOfPhysicalCPU = 1;
    }
  // LogicalProcessorsPerPhysical>1 => hyperthreading.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical=
      this->NumberOfLogicalCPU/this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer,"cpu MHz");
  if(!CPUSpeed.empty())
    {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
    }
#ifdef __linux
  else
    {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer,"Cpu0ClkTck");
    this->CPUSpeedInMHz = static_cast<float>(
                                 strtoull(CPUSpeed.c_str(),0,16))/1000000.0f;
    }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer,"cpu family");
  if(familyStr.empty())
    {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer,"CPU architecture");
    }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer,"vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP)
    {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
    }

  // Chip Model
  this->ChipID.Model = atoi(this->ExtractValueFromCpuInfoFile(buffer,"model").c_str());
  if(!this->RetrieveClassicalCPUIdentity())
    {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer,"cpu");
    if(!cpuname.empty())
      {
      this->ChipID.ProcessorName = cpuname;
      }
    }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer,"stepping");
  if(cpurev.empty())
    {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer,"CPU revision");
    }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName = this->ExtractValueFromCpuInfoFile(buffer,"model name").c_str();

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache"); // e.g. PA-RISC
  cachename.push_back("D-cache"); // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (size_t index = 0; index < cachename.size(); index ++)
    {
    std::string cacheSize = this->ExtractValueFromCpuInfoFile(buffer,cachename[index]);
    if (!cacheSize.empty())
      {
      pos = cacheSize.find(" KB");
      if(pos!=cacheSize.npos)
        {
        cacheSize = cacheSize.substr(0,pos);
        }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
      }
    }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer,"flags");
  if(!cpurev.empty())
    {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ")!=std::string::npos))
      {
      this->Features.HasFPU = true;
      }
    if ((cpuflags.find(" tsc ")!=std::string::npos))
      {
      this->Features.HasTSC = true;
      }
    if ((cpuflags.find(" mmx ")!=std::string::npos))
      {
      this->Features.HasMMX = true;
      }
    if ((cpuflags.find(" sse ")!=std::string::npos))
      {
      this->Features.HasSSE = true;
      }
    if ((cpuflags.find(" sse2 ")!=std::string::npos))
      {
      this->Features.HasSSE2 = true;
      }
    if ((cpuflags.find(" apic ")!=std::string::npos))
      {
      this->Features.HasAPIC = true;
      }
    if ((cpuflags.find(" cmov ")!=std::string::npos))
      {
      this->Features.HasCMOV = true;
      }
    if ((cpuflags.find(" mtrr ")!=std::string::npos))
      {
      this->Features.HasMTRR = true;
      }
    if ((cpuflags.find(" acpi ")!=std::string::npos))
      {
      this->Features.HasACPI = true;
      }
    if ((cpuflags.find(" 3dnow ")!=std::string::npos))
      {
      this->Features.ExtendedFeatures.Has3DNow = true;
      }
    }

  return true;
}